

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSAPublicKey.cpp
# Opt level: O1

void __thiscall OSSLDSAPublicKey::~OSSLDSAPublicKey(OSSLDSAPublicKey *this)

{
  *(undefined ***)&this->super_DSAPublicKey = &PTR_serialise_0019e648;
  DSA_free((DSA *)this->dsa);
  *(undefined ***)&this->super_DSAPublicKey = &PTR_serialise_0019d620;
  (this->super_DSAPublicKey).y._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_DSAPublicKey).y.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->super_DSAPublicKey).g._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_DSAPublicKey).g.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->super_DSAPublicKey).q._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_DSAPublicKey).q.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->super_DSAPublicKey).p._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_DSAPublicKey).p.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return;
}

Assistant:

OSSLDSAPublicKey::~OSSLDSAPublicKey()
{
	DSA_free(dsa);
}